

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Writer::WriteVRR(OSTEI_VRR_Writer *this,ostream *os)

{
  _Rb_tree_node_base *p_Var1;
  OSTEI_VRR_Writer *pOVar2;
  bool bVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  QAM *this_00;
  char *pcVar6;
  string *this_01;
  int iVar7;
  allocator local_131;
  OSTEI_VRR_Writer *local_130;
  undefined1 local_128 [16];
  _Alloc_hider local_118;
  _Rb_tree_node_base *local_110;
  undefined1 local_108 [16];
  _Base_ptr local_f8;
  _Rb_tree_node_base *local_f0;
  undefined1 local_e8 [24];
  QAM *local_d0;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  std::operator<<(os,"\n");
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar4,"//////////////////////////////////////////////\n");
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar4,"// Primitive integrals: Vertical recurrance\n");
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar4,"//////////////////////////////////////////////\n");
  std::operator<<(os,"\n");
  local_130 = this;
  OSTEI_VRR_Algorithm_Base::GetAllInt_2p((IntSet *)local_128,this->vrr_algo_);
  p_Var1 = (_Rb_tree_node_base *)(local_128 + 8);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = "_over_2p = one_over_2p;\n";
    }
    else {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      poVar4 = std::operator<<(poVar4,"_over_2p = SIMINT_MUL(const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = ", one_over_2p);\n";
    }
    std::operator<<(poVar4,pcVar6);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2q((IntSet *)local_128,local_130->vrr_algo_);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = "_over_2q = one_over_2q;\n";
    }
    else {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      poVar4 = std::operator<<(poVar4,"_over_2q = SIMINT_MUL(const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = ", one_over_2q);\n";
    }
    std::operator<<(poVar4,pcVar6);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2pq((IntSet *)local_128,local_130->vrr_algo_);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = "_over_2pq = one_over_2pq;\n";
    }
    else {
      poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      poVar4 = std::operator<<(poVar4,"_over_2pq = SIMINT_MUL(const_");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      pcVar6 = ", one_over_2pq);\n";
    }
    std::operator<<(poVar4,pcVar6);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  std::operator<<(os,"\n\n");
  OSTEI_VRR_Algorithm_Base::GetAMOrder((QAMList *)(local_e8 + 0x10),local_130->vrr_algo_);
  for (this_00 = (QAM *)local_e8._16_8_; this_00 != local_d0; this_00 = this_00 + 1) {
    std::__cxx11::string::string((string *)&local_f8,"",&local_131);
    local_128._0_4_ = 0;
    local_128._4_4_ = 0;
    local_128._8_4_ = 0;
    local_128._12_4_ = 0;
    local_118._M_p = local_108;
    if (local_f8 == (_Base_ptr)local_e8) {
      local_108._8_8_ = local_e8._8_8_;
    }
    else {
      local_118._M_p = (pointer)local_f8;
    }
    local_108._1_7_ = local_e8._1_7_;
    local_108[0] = local_e8[0];
    local_110 = local_f0;
    local_f0 = (_Rb_tree_node_base *)0x0;
    local_e8[0] = _S_red;
    local_f8 = (_Base_ptr)local_e8;
    bVar3 = QAM::operator==(this_00,(QAM *)local_128);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    pOVar2 = local_130;
    if (!bVar3) {
      iVar7 = (this_00->qam)._M_elems[3] + (this_00->qam)._M_elems[1] +
              (this_00->qam)._M_elems[2] + (this_00->qam)._M_elems[0];
      if (iVar7 < local_130->start_external_) {
        QAM::QAM((QAM *)local_60,this_00);
        (*pOVar2->_vptr_OSTEI_VRR_Writer[3])(pOVar2,os,local_60);
        this_01 = (string *)(local_60 + 0x10);
      }
      else if (iVar7 < local_130->start_general_) {
        QAM::QAM((QAM *)local_90,this_00);
        (*pOVar2->_vptr_OSTEI_VRR_Writer[4])(pOVar2,os,local_90);
        this_01 = (string *)(local_90 + 0x10);
      }
      else {
        QAM::QAM((QAM *)local_c0,this_00);
        (*pOVar2->_vptr_OSTEI_VRR_Writer[5])(pOVar2,os,local_c0);
        this_01 = (string *)(local_c0 + 0x10);
      }
      std::__cxx11::string::~string(this_01);
      std::operator<<(os,"\n\n");
    }
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)(local_e8 + 0x10));
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR(std::ostream & os) const
{
    os << "\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << indent5 << "// Primitive integrals: Vertical recurrance\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << "\n";

    // constants
    for(const auto & it : vrr_algo_.GetAllInt_2p())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = one_over_2p;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(const_" << it << ", one_over_2p);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2q())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = one_over_2q;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(const_" << it << ", one_over_2q);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2pq())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = one_over_2pq;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(const_" << it << ", one_over_2pq);\n";
    }

    os << "\n\n";

    // actually write out
    for(const auto & am : vrr_algo_.GetAMOrder())
    {
        if(am == QAM{0,0,0,0})
            continue;

        int L = am[0] + am[1] + am[2] + am[3];
        if(L < start_external_)
            WriteVRR_Inline_(os, am);
        else if(L < start_general_)
            WriteVRR_External_(os, am);
        else
            WriteVRR_General_(os, am);

        os << "\n\n";
    }
    
}